

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_moveq(m68k_info *info)

{
  cs_m68k *pcVar1;
  anon_union_8_5_85a7a27f_for_cs_m68k_op_0 aVar2;
  
  pcVar1 = build_init_op(info,0x11e,2,0);
  pcVar1->operands[0].type = M68K_OP_IMM;
  pcVar1->operands[0].address_mode = M68K_AM_IMMEDIATE;
  aVar2.imm._1_7_ = 0;
  aVar2.imm._0_1_ = (byte)info->ir;
  pcVar1->operands[0].field_0 = aVar2;
  pcVar1->operands[1].address_mode = M68K_AM_REG_DIRECT_DATA;
  pcVar1->operands[1].field_0.reg = (info->ir >> 9 & 7) + M68K_REG_D0;
  return;
}

Assistant:

static void d68000_moveq(m68k_info *info)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;

	cs_m68k* ext = build_init_op(info, M68K_INS_MOVEQ, 2, 0);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->type = M68K_OP_IMM;
	op0->address_mode = M68K_AM_IMMEDIATE;
	op0->imm = (info->ir & 0xff);

	op1->address_mode = M68K_AM_REG_DIRECT_DATA;
	op1->reg = M68K_REG_D0 + ((info->ir >> 9) & 7);
}